

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O0

int __thiscall nuraft::snapshot_io_mgr::shutdown(snapshot_io_mgr *this,int __fd,int __how)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  EventAwaiter *unaff_retaddr;
  bool in_stack_ffffffffffffffef;
  
  std::atomic<bool>::operator=((atomic<bool> *)this,in_stack_ffffffffffffffef);
  bVar1 = std::thread::joinable(&this->io_thread_);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    std::__shared_ptr_access<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x237e1f);
    EventAwaiter::invoke(unaff_retaddr);
    iVar2 = std::thread::join();
  }
  return iVar2;
}

Assistant:

void snapshot_io_mgr::shutdown() {
    terminating_ = true;
    if (io_thread_.joinable()) {
        io_thread_ea_->invoke();
        io_thread_.join();
    }
}